

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

void lyd_free_internal_r(lyd_node *node,int top)

{
  lyd_node *plVar1;
  lyd_node *node_00;
  
  if (node == (lyd_node *)0x0) {
    return;
  }
  lyd_unlink_internal(node,(top == 0) + 1);
  if ((node->schema->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
    node_00 = node->child;
    while (node_00 != (lyd_node *)0x0) {
      plVar1 = node_00->next;
      lyd_free_internal_r(node_00,0);
      node_00 = plVar1;
    }
  }
  _lyd_free_node(node);
  return;
}

Assistant:

static void
lyd_free_internal_r(struct lyd_node *node, int top)
{
    struct lyd_node *next, *iter;

    if (!node) {
        return;
    }

    /* if freeing top-level, always remove it from the parent hash table */
    lyd_unlink_internal(node, (top ? 1 : 2));

    if (!(node->schema->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA))) {
        /* free children */
        LY_TREE_FOR_SAFE(node->child, next, iter) {
            lyd_free_internal_r(iter, 0);
        }
    }

    _lyd_free_node(node);
}